

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

size_t __thiscall Catch::StringStreams::add(StringStreams *this)

{
  StringStreams *pSVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  value_type index;
  value_type local_20;
  StringStreams *local_18;
  StringStreams *this_local;
  
  local_18 = this;
  bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->m_unused);
  if (bVar2) {
    Detail::make_unique<std::__cxx11::ostringstream>();
    std::
    vector<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back(&this->m_streams,&local_20);
    Detail::
    unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unique_ptr(&local_20);
    sVar3 = std::
            vector<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&this->m_streams);
    this_local = (StringStreams *)(sVar3 - 1);
  }
  else {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->m_unused);
    pSVar1 = (StringStreams *)*pvVar4;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->m_unused);
    this_local = pSVar1;
  }
  return (size_t)this_local;
}

Assistant:

auto add() -> std::size_t {
            if( m_unused.empty() ) {
                m_streams.push_back( Detail::make_unique<std::ostringstream>() );
                return m_streams.size()-1;
            }
            else {
                auto index = m_unused.back();
                m_unused.pop_back();
                return index;
            }
        }